

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O3

void Gia_MmFlexStop(Gia_MmFlex_t *p,int fVerbose)

{
  int iVar1;
  long lVar2;
  
  if (p != (Gia_MmFlex_t *)0x0) {
    if (fVerbose != 0) {
      printf("Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
             (ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nMemoryUsed,(ulong)(uint)p->nMemoryAlloc);
    }
    iVar1 = p->nChunks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->pChunks[lVar2] != (char *)0x0) {
          free(p->pChunks[lVar2]);
          p->pChunks[lVar2] = (char *)0x0;
          iVar1 = p->nChunks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (p->pChunks != (char **)0x0) {
      free(p->pChunks);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Gia_MmFlexStop( Gia_MmFlex_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
            p->nChunkSize, p->nChunks );
        printf( "   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
            p->nEntriesUsed, p->nMemoryUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}